

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SixAxisForceTorqueSensor.cpp
# Opt level: O0

void __thiscall
iDynTree::SixAxisForceTorqueSensor::~SixAxisForceTorqueSensor(SixAxisForceTorqueSensor *this)

{
  undefined8 *in_RDI;
  SixAxisForceTorqueSensorPrivateAttributes *this_00;
  
  *in_RDI = &PTR__SixAxisForceTorqueSensor_004fa850;
  this_00 = (SixAxisForceTorqueSensorPrivateAttributes *)in_RDI[1];
  if (this_00 != (SixAxisForceTorqueSensorPrivateAttributes *)0x0) {
    SixAxisForceTorqueSensorPrivateAttributes::~SixAxisForceTorqueSensorPrivateAttributes(this_00);
    operator_delete(this_00,0x160);
  }
  JointSensor::~JointSensor((JointSensor *)0x487001);
  return;
}

Assistant:

SixAxisForceTorqueSensor::~SixAxisForceTorqueSensor()
{
    delete this->pimpl;
}